

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFObjectHandle.cc
# Opt level: O0

set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
QPDFObjectHandle::getResourceNames_abi_cxx11_
          (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,QPDFObjectHandle *this)

{
  bool bVar1;
  reference ppVar2;
  type *__x;
  BaseHandle *this_00;
  type *val2;
  type *key2;
  _Self local_90;
  iterator __end2;
  iterator __begin2;
  Dictionary *__range2;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>
  *item;
  _Self local_58;
  iterator __end1;
  iterator __begin1;
  Dictionary local_38;
  Dictionary *local_28;
  Dictionary *__range1;
  QPDFObjectHandle *local_18;
  QPDFObjectHandle *this_local;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *result;
  
  __range1._7_1_ = 0;
  local_18 = this;
  this_local = (QPDFObjectHandle *)__return_storage_ptr__;
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set(__return_storage_ptr__);
  as_dictionary((QPDFObjectHandle *)&local_38,(typed)this);
  local_28 = &local_38;
  __end1 = ::qpdf::BaseDictionary::begin_abi_cxx11_(&local_28->super_BaseDictionary);
  local_58._M_node =
       (_Base_ptr)::qpdf::BaseDictionary::end_abi_cxx11_(&local_28->super_BaseDictionary);
  while (bVar1 = std::operator!=(&__end1,&local_58), bVar1) {
    ppVar2 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>
             ::operator*(&__end1);
    as_dictionary((QPDFObjectHandle *)&__begin2,(char)ppVar2 + 0x20);
    __end2 = ::qpdf::BaseDictionary::begin_abi_cxx11_((BaseDictionary *)&__begin2);
    local_90._M_node =
         (_Base_ptr)::qpdf::BaseDictionary::end_abi_cxx11_((BaseDictionary *)&__begin2);
    while (bVar1 = std::operator!=(&__end2,&local_90), bVar1) {
      ppVar2 = std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>
               ::operator*(&__end2);
      __x = std::get<0ul,std::__cxx11::string_const,QPDFObjectHandle>(ppVar2);
      this_00 = &std::get<1ul,std::__cxx11::string_const,QPDFObjectHandle>(ppVar2)->super_BaseHandle
      ;
      bVar1 = ::qpdf::BaseHandle::null(this_00);
      if (!bVar1) {
        std::
        set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::insert(__return_storage_ptr__,__x);
      }
      std::
      _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>
      ::operator++(&__end2);
    }
    ::qpdf::Dictionary::~Dictionary((Dictionary *)&__begin2);
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>
    ::operator++(&__end1);
  }
  ::qpdf::Dictionary::~Dictionary(&local_38);
  return __return_storage_ptr__;
}

Assistant:

std::set<std::string>
QPDFObjectHandle::getResourceNames() const
{
    // Return second-level dictionary keys
    std::set<std::string> result;
    for (auto const& item: as_dictionary(strict)) {
        for (auto const& [key2, val2]: item.second.as_dictionary(strict)) {
            if (!val2.null()) {
                result.insert(key2);
            }
        }
    }
    return result;
}